

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

DynamicType * __thiscall
Js::JavascriptLibrary::CreateObjectType
          (JavascriptLibrary *this,RecyclableObject *prototype,TypeId typeId,
          uint16 requestedInlineSlotCapacity)

{
  Type TVar1;
  ushort uVar2;
  ScriptContext *pSVar3;
  ScriptContext *pSVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint16 offsetOfInlineSlots;
  Type TVar9;
  ushort uVar10;
  int iVar11;
  undefined4 *puVar12;
  DynamicTypeHandler *pDVar13;
  undefined7 extraout_var;
  DynamicType *pDVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined6 in_register_0000000a;
  char16_t *format;
  char16_t_conflict local_858 [4];
  char16 reason [1024];
  DynamicType *local_38;
  DynamicType *dynamicType;
  
  bVar6 = FunctionBody::DoObjectHeaderInliningForConstructor
                    ((uint32)CONCAT62(in_register_0000000a,requestedInlineSlotCapacity));
  offsetOfInlineSlots = 0x20;
  if (bVar6) {
    offsetOfInlineSlots = DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots();
  }
  local_38 = (DynamicType *)0x0;
  pSVar3 = (((((prototype->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  swprintf_s(local_858,0x400,(char16_t_conflict *)L"Cache not populated.");
  if (typeId != TypeIds_Object) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1a90,"(typeId == TypeIds_Object)",
                                "CreateObjectType() is used to create other objects. Please update cacheSlot for protoObjectCache first."
                               );
    if (!bVar7) goto LAB_00c031f0;
    *puVar12 = 0;
  }
  if ((((pSVar3 == pSVar4) &&
       (iVar11 = (*(prototype->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x14])
                           (prototype,prototype,0,&local_38,0,
                            (this->super_JavascriptLibraryBase).scriptContext.ptr), iVar11 != 0)) &&
      (local_38 != (DynamicType *)0x0)) &&
     (local_38 != (DynamicType *)(this->super_JavascriptLibraryBase).undefinedValue.ptr)) {
    pDVar13 = (local_38->typeHandler).ptr;
    bVar7 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(pDVar13);
    if (bVar6 == bVar7) {
      TVar1 = pDVar13->inlineSlotCapacity;
      reason._2040_8_ = pDVar13;
      if (bVar6) {
        TVar9 = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity
                          (requestedInlineSlotCapacity);
      }
      else {
        TVar9 = DynamicTypeHandler::RoundUpInlineSlotCapacity(requestedInlineSlotCapacity);
      }
      pDVar13 = (DynamicTypeHandler *)reason._2040_8_;
      if (TVar1 != TVar9) goto LAB_00c03135;
      if (local_38->isShared == false) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                    ,0x1aa5,"(dynamicType->GetIsShared())",
                                    "dynamicType->GetIsShared()");
        if (!bVar6) {
LAB_00c031f0:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar12 = 0;
      }
      bVar6 = Phases::IsEnabled((Phases *)&DAT_015cd718,TypeShareForChangePrototypePhase);
      if (bVar6) {
        bVar6 = Phases::IsEnabled((Phases *)&DAT_015cd718,TypeShareForChangePrototypePhase);
        if ((bVar6) && (DAT_015d346a == '\x01')) {
          Output::Print(L"TypeSharing: Reusing prototype [0x%p] object\'s InlineSlot cache 0x%p in CreateObject.\n"
                        ,prototype,local_38);
        }
        else {
          Output::Print(L"TypeSharing: Reusing prototype object\'s InlineSlot cache in __proto__.\n"
                       );
        }
        Output::Flush();
      }
      bVar7 = false;
      pDVar14 = local_38;
    }
    else {
LAB_00c03135:
      bVar8 = Phases::IsEnabled((Phases *)&DAT_015cd718,TypeShareForChangePrototypePhase);
      pDVar14 = (DynamicType *)CONCAT71(extraout_var,bVar8);
      bVar7 = true;
      if ((bVar8) && (pDVar14 = (DynamicType *)&Configuration::Global, DAT_015d346a == '\x01')) {
        bVar7 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(pDVar13);
        if (bVar6 == bVar7) {
          uVar2 = pDVar13->inlineSlotCapacity;
          if (bVar6) {
            uVar10 = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity
                               (requestedInlineSlotCapacity);
          }
          else {
            uVar10 = DynamicTypeHandler::RoundUpInlineSlotCapacity(requestedInlineSlotCapacity);
          }
          iVar11 = swprintf_s(local_858,0x400,
                              (char16_t_conflict *)
                              L"inlineSlotCapacity mismatch. Required = %d, Cached = %d",
                              (ulong)uVar10,(ulong)uVar2);
          pDVar14 = (DynamicType *)CONCAT44(extraout_var_01,iVar11);
        }
        else {
          iVar11 = swprintf_s(local_858,0x400,
                              (char16_t_conflict *)L"useObjectHeaderInlining mismatch.");
          pDVar14 = (DynamicType *)CONCAT44(extraout_var_00,iVar11);
        }
        bVar7 = true;
      }
    }
    if (!bVar7) {
      return pDVar14;
    }
  }
  bVar6 = Phases::IsEnabled((Phases *)&DAT_015cd718,TypeShareForChangePrototypePhase);
  if ((bVar6) && (DAT_015d346a == '\x01')) {
    if (local_38 == (DynamicType *)0x0) {
      format = L"cached type was null";
    }
    else {
      if (local_38 != (DynamicType *)(this->super_JavascriptLibraryBase).undefinedValue.ptr)
      goto LAB_00c02f4a;
      format = L"cached type was undefined";
    }
    swprintf_s(local_858,0x400,(char16_t_conflict *)format);
  }
LAB_00c02f4a:
  pDVar14 = local_38;
  pDVar13 = (DynamicTypeHandler *)
            PathTypeHandlerNoAttr::New
                      ((this->super_JavascriptLibraryBase).scriptContext.ptr,(this->rootPath).ptr,0,
                       requestedInlineSlotCapacity,offsetOfInlineSlots,true,true,(DynamicType *)0x0)
  ;
  local_38 = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,typeId,prototype
                              ,RecyclableObject::DefaultEntryPoint,pDVar13,true,true);
  if (pSVar3 == pSVar4) {
    (*(prototype->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x19])(prototype,0,local_38,8,0);
    bVar6 = Phases::IsEnabled((Phases *)&DAT_015cd718,TypeShareForChangePrototypePhase);
    if (bVar6) {
      bVar6 = Phases::IsEnabled((Phases *)&DAT_015cd718,TypeShareForChangePrototypePhase);
      if ((bVar6) && (DAT_015d346a == '\x01')) {
        Output::Print(L"TypeSharing: Updating prototype [0x%p] object\'s InlineSlot cache from 0x%p to 0x%p in CreateObject. Reason = %s\n"
                      ,prototype,pDVar14,local_38,local_858);
      }
      else {
        Output::Print(
                     L"TypeSharing: Updating prototype object\'s InlineSlot cache in CreateObject.\n"
                     );
      }
      Output::Flush();
    }
  }
  return local_38;
}

Assistant:

DynamicType* JavascriptLibrary::CreateObjectType(RecyclableObject* prototype, Js::TypeId typeId, uint16 requestedInlineSlotCapacity)
    {
        const bool useObjectHeaderInlining = FunctionBody::DoObjectHeaderInliningForConstructor(requestedInlineSlotCapacity);
        const uint16 offsetOfInlineSlots =
            useObjectHeaderInlining
            ? DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots()
            : sizeof(DynamicObject);

        DynamicType* dynamicType = nullptr;
        const bool useCache = prototype->GetScriptContext() == this->scriptContext;
#if DBG
        DynamicType* oldCachedType = nullptr;
        char16 reason[1024];
        swprintf_s(reason, 1024, _u("Cache not populated."));
#endif
        // Always use `TypeOfPrototypeObjectInlined` because we are creating DynamicType of TypeIds_Object
        AssertMsg(typeId == TypeIds_Object, "CreateObjectType() is used to create other objects. Please update cacheSlot for protoObjectCache first.");

        if (useCache &&
            prototype->GetInternalProperty(prototype, Js::InternalPropertyIds::TypeOfPrototypeObjectInlined, (Js::Var*) &dynamicType, nullptr, this->scriptContext))
        {
            //If the prototype is externalObject, then ExternalObject::Reinitialize can set all the properties to undefined in navigation scenario.
            //Check to make sure dynamicType which is stored as a Js::Var is not undefined.
            //See Blue 419324
            if (dynamicType != nullptr && (Js::Var)dynamicType != this->GetUndefined())
            {
                DynamicTypeHandler *const dynamicTypeHandler = dynamicType->GetTypeHandler();
                if (dynamicTypeHandler->IsObjectHeaderInlinedTypeHandler() == useObjectHeaderInlining &&
                    (
                        dynamicTypeHandler->GetInlineSlotCapacity() ==
                        (
                            useObjectHeaderInlining
                            ? DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(requestedInlineSlotCapacity)
                            : DynamicTypeHandler::RoundUpInlineSlotCapacity(requestedInlineSlotCapacity)
                            )
                        ))
                {
                    Assert(dynamicType->GetIsShared());

                    if (PHASE_TRACE1(TypeShareForChangePrototypePhase))
                    {
#if DBG
                        if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
                        {
                            Output::Print(_u("TypeSharing: Reusing prototype [0x%p] object's InlineSlot cache 0x%p in CreateObject.\n"), prototype, dynamicType);
                        }
                        else
                        {
#endif
                            Output::Print(_u("TypeSharing: Reusing prototype object's InlineSlot cache in __proto__.\n"));
#if DBG
                        }
#endif
                        Output::Flush();
                    }

                    return dynamicType;
                }
#if DBG
                if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
                {
                    if (dynamicTypeHandler->IsObjectHeaderInlinedTypeHandler() != useObjectHeaderInlining)
                    {
                        swprintf_s(reason, 1024, _u("useObjectHeaderInlining mismatch."));
                    }
                    else
                    {
                        uint16 cachedCapacity = dynamicTypeHandler->GetInlineSlotCapacity();
                        uint16 requiredCapacity = useObjectHeaderInlining
                            ? DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(requestedInlineSlotCapacity)
                            : DynamicTypeHandler::RoundUpInlineSlotCapacity(requestedInlineSlotCapacity);

                        swprintf_s(reason, 1024, _u("inlineSlotCapacity mismatch. Required = %d, Cached = %d"), requiredCapacity, cachedCapacity);
                    }
                }
#endif
            }

        }

#if DBG
        if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
        {
            if (dynamicType == nullptr)
            {
                swprintf_s(reason, 1024, _u("cached type was null"));
            }
            else if ((Js::Var)dynamicType == this->GetUndefined())
            {
                swprintf_s(reason, 1024, _u("cached type was undefined"));
            }
        }
        oldCachedType = dynamicType;
#endif
        PathTypeHandlerNoAttr* typeHandler = PathTypeHandlerNoAttr::New(scriptContext, this->GetRootPath(), 0, requestedInlineSlotCapacity, offsetOfInlineSlots, true, true);
        dynamicType = DynamicType::New(scriptContext, typeId, prototype, RecyclableObject::DefaultEntryPoint, typeHandler, true, true);

        if (useCache)
        {
            prototype->SetInternalProperty(Js::InternalPropertyIds::TypeOfPrototypeObjectInlined, (Var)dynamicType, PropertyOperationFlags::PropertyOperation_Force, nullptr);
            if (PHASE_TRACE1(TypeShareForChangePrototypePhase))
            {
#if DBG
                if (PHASE_VERBOSE_TRACE1(TypeShareForChangePrototypePhase))
                {
                    Output::Print(_u("TypeSharing: Updating prototype [0x%p] object's InlineSlot cache from 0x%p to 0x%p in CreateObject. Reason = %s\n"), prototype, oldCachedType, dynamicType, reason);
                }
                else
                {
#endif
                    Output::Print(_u("TypeSharing: Updating prototype object's InlineSlot cache in CreateObject.\n"));
#if DBG
                }
#endif
                Output::Flush();
            }
        }

        return dynamicType;
    }